

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

void Omega_h::update_class_sets(ClassSets *p_sets,InputMap *pl)

{
  _Rb_tree_node_base *name;
  pointer *ppCVar1;
  iterator __position;
  ClassPair CVar2;
  int iVar3;
  int iVar4;
  InputList *this;
  Input *input;
  InputList *this_00;
  mapped_type *this_01;
  _Rb_tree_node_base *p_Var5;
  int i;
  int iVar6;
  ClassPair local_58;
  InputMap *local_50;
  _Rb_tree_node_base *local_48;
  _Rb_tree_node_base *local_40;
  ClassSets *local_38;
  
  local_38 = p_sets;
  InputMapIterator::InputMapIterator
            ((InputMapIterator *)&local_58,
             (pl->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  p_Var5 = (_Rb_tree_node_base *)CONCAT44(local_58.id,local_58.dim);
  InputMapIterator::InputMapIterator
            ((InputMapIterator *)&local_58,
             (const_iterator)&(pl->map)._M_t._M_impl.super__Rb_tree_header);
  local_48 = (_Rb_tree_node_base *)CONCAT44(local_58.id,local_58.dim);
  local_50 = pl;
  if (p_Var5 != local_48) {
    do {
      name = p_Var5 + 1;
      local_40 = p_Var5;
      this = InputMap::get_list(local_50,(string *)name);
      iVar6 = (int)((ulong)((long)(this->entries).
                                  super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->entries).
                                 super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      if (0 < iVar6) {
        i = 0;
        do {
          input = InputList::at(this,i);
          input->used = true;
          this_00 = as_type<Omega_h::InputList>(input);
          if (((long)(this_00->entries).
                     super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->entries).
                     super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                     ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) != 0x20) {
            fail("Expected \"%s\" to be an array of int pairs\n",*(undefined8 *)name);
          }
          iVar3 = InputList::get<int>(this_00,0);
          iVar4 = InputList::get<int>(this_00,1);
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                    ::operator[](local_38,(key_type *)name);
          __position._M_current =
               (this_01->super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_58.dim = iVar3;
          local_58.id = iVar4;
          if (__position._M_current ==
              (this_01->super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>)
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::
            _M_realloc_insert<Omega_h::ClassPair>(this_01,__position,&local_58);
          }
          else {
            CVar2.id = iVar4;
            CVar2.dim = iVar3;
            *__position._M_current = CVar2;
            ppCVar1 = &(this_01->
                       super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          i = i + 1;
        } while (iVar6 != i);
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_40);
    } while (p_Var5 != local_48);
  }
  return;
}

Assistant:

void update_class_sets(ClassSets* p_sets, InputMap& pl) {
  ClassSets& sets = *p_sets;
  for (auto& set_name : pl) {
    auto& pairs = pl.get_list(set_name);
    auto npairs = pairs.size();
    for (decltype(npairs) i = 0; i < npairs; ++i) {
      auto& pair = pairs.get_list(i);
      if (pair.size() != 2) {
        Omega_h_fail(
            "Expected \"%s\" to be an array of int pairs\n", set_name.c_str());
      }
      auto class_dim = Int(pair.get<int>(0));
      auto class_id = LO(pair.get<int>(1));
      sets[set_name].push_back({class_dim, class_id});
    }
  }
}